

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_logger.h
# Opt level: O0

void __thiscall leveldb::PosixLogger::Logv(PosixLogger *this,char *format,__va_list_tag *arguments)

{
  bool bVar1;
  undefined1 auVar2 [4];
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  undefined4 uVar7;
  int iVar8;
  id __id;
  ulong uVar9;
  undefined8 uVar10;
  int *local_490;
  int local_484;
  undefined8 uStack_478;
  va_list arguments_copy;
  int local_454;
  int buffer_offset;
  char *buffer;
  int buffer_size;
  int iteration;
  int dynamic_buffer_size;
  char stack_buffer [512];
  string local_228 [4];
  int kStackBufferSize;
  string thread_id;
  ostringstream local_200 [8];
  ostringstream thread_stream;
  undefined1 local_80 [4];
  int kMaxThreadIdSize;
  tm now_components;
  time_t now_seconds;
  timeval now_timeval;
  __va_list_tag *arguments_local;
  char *format_local;
  PosixLogger *this_local;
  
  now_timeval.tv_usec = (__suseconds_t)arguments;
  gettimeofday((timeval *)&now_seconds,(__timezone_ptr_t)0x0);
  now_components.tm_zone = (char *)now_seconds;
  localtime_r((time_t *)&now_components.tm_zone,(tm *)local_80);
  std::__cxx11::ostringstream::ostringstream(local_200);
  __id = std::this_thread::get_id();
  std::operator<<((basic_ostream<char,_std::char_traits<char>_> *)local_200,__id);
  std::__cxx11::ostringstream::str();
  uVar9 = std::__cxx11::string::size();
  if (0x20 < uVar9) {
    std::__cxx11::string::resize((ulong)local_228);
  }
  buffer_size = 0;
  bVar1 = false;
  do {
    if (true < bVar1) {
LAB_0013d065:
      std::__cxx11::string::~string(local_228);
      std::__cxx11::ostringstream::~ostringstream(local_200);
      return;
    }
    if (bVar1) {
      uVar9 = (ulong)buffer_size;
      if ((long)uVar9 < 0) {
        uVar9 = 0xffffffffffffffff;
      }
      local_490 = (int *)operator_new__(uVar9);
      local_484 = buffer_size;
    }
    else {
      local_484 = 0x200;
      local_490 = &iteration;
    }
    iVar4 = now_components.tm_min;
    iVar3 = now_components.tm_sec;
    iVar8 = kMaxThreadIdSize;
    auVar2 = local_80;
    uVar5 = now_components.tm_mday + 0x76c;
    uVar6 = now_components.tm_hour + 1;
    uVar7 = (undefined4)now_timeval.tv_sec;
    uVar10 = std::__cxx11::string::c_str();
    iVar8 = snprintf((char *)local_490,(long)local_484,"%04d/%02d/%02d-%02d:%02d:%02d.%06d %s ",
                     (ulong)uVar5,(ulong)uVar6,(ulong)(uint)iVar4,iVar3,iVar8,auVar2,uVar7,uVar10);
    if (0x3c < iVar8) {
      __assert_fail("buffer_offset <= 28 + kMaxThreadIdSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/./util/posix_logger.h"
                    ,0x4b,"virtual void leveldb::PosixLogger::Logv(const char *, __va_list_tag *)");
    }
    if (local_484 <= iVar8) {
      __assert_fail("buffer_offset < buffer_size",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/./util/posix_logger.h"
                    ,0x4e,"virtual void leveldb::PosixLogger::Logv(const char *, __va_list_tag *)");
    }
    arguments_copy[0].overflow_arg_area = *(void **)(now_timeval.tv_usec + 0x10);
    uStack_478 = *(undefined8 *)now_timeval.tv_usec;
    arguments_copy[0]._0_8_ = *(undefined8 *)(now_timeval.tv_usec + 8);
    local_454 = vsnprintf((char *)((long)local_490 + (long)iVar8),(long)(local_484 - iVar8),format,
                          &uStack_478);
    local_454 = local_454 + iVar8;
    if (local_454 < local_484 + -1) {
      if (*(char *)((long)local_490 + (long)(local_454 + -1)) != '\n') {
        *(undefined1 *)((long)local_490 + (long)local_454) = 10;
        local_454 = local_454 + 1;
      }
      if (local_484 < local_454) {
        __assert_fail("buffer_offset <= buffer_size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/./util/posix_logger.h"
                      ,0x71,"virtual void leveldb::PosixLogger::Logv(const char *, __va_list_tag *)"
                     );
      }
      fwrite(local_490,1,(long)local_454,(FILE *)this->fp_);
      fflush((FILE *)this->fp_);
      if ((bVar1) && (local_490 != (int *)0x0)) {
        operator_delete__(local_490);
      }
      goto LAB_0013d065;
    }
    if (bVar1) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/./util/posix_logger.h"
                    ,0x67,"virtual void leveldb::PosixLogger::Logv(const char *, __va_list_tag *)");
    }
    buffer_size = local_454 + 2;
    bVar1 = true;
  } while( true );
}

Assistant:

void Logv(const char* format, std::va_list arguments) override {
    // Record the time as close to the Logv() call as possible.
    struct ::timeval now_timeval;
    ::gettimeofday(&now_timeval, nullptr);
    const std::time_t now_seconds = now_timeval.tv_sec;
    struct std::tm now_components;
    ::localtime_r(&now_seconds, &now_components);

    // Record the thread ID.
    constexpr const int kMaxThreadIdSize = 32;
    std::ostringstream thread_stream;
    thread_stream << std::this_thread::get_id();
    std::string thread_id = thread_stream.str();
    if (thread_id.size() > kMaxThreadIdSize) {
      thread_id.resize(kMaxThreadIdSize);
    }

    // We first attempt to print into a stack-allocated buffer. If this attempt
    // fails, we make a second attempt with a dynamically allocated buffer.
    constexpr const int kStackBufferSize = 512;
    char stack_buffer[kStackBufferSize];
    static_assert(sizeof(stack_buffer) == static_cast<size_t>(kStackBufferSize),
                  "sizeof(char) is expected to be 1 in C++");

    int dynamic_buffer_size = 0;  // Computed in the first iteration.
    for (int iteration = 0; iteration < 2; ++iteration) {
      const int buffer_size =
          (iteration == 0) ? kStackBufferSize : dynamic_buffer_size;
      char* const buffer =
          (iteration == 0) ? stack_buffer : new char[dynamic_buffer_size];

      // Print the header into the buffer.
      int buffer_offset = std::snprintf(
          buffer, buffer_size, "%04d/%02d/%02d-%02d:%02d:%02d.%06d %s ",
          now_components.tm_year + 1900, now_components.tm_mon + 1,
          now_components.tm_mday, now_components.tm_hour, now_components.tm_min,
          now_components.tm_sec, static_cast<int>(now_timeval.tv_usec),
          thread_id.c_str());

      // The header can be at most 28 characters (10 date + 15 time +
      // 3 delimiters) plus the thread ID, which should fit comfortably into the
      // static buffer.
      assert(buffer_offset <= 28 + kMaxThreadIdSize);
      static_assert(28 + kMaxThreadIdSize < kStackBufferSize,
                    "stack-allocated buffer may not fit the message header");
      assert(buffer_offset < buffer_size);

      // Print the message into the buffer.
      std::va_list arguments_copy;
      va_copy(arguments_copy, arguments);
      buffer_offset +=
          std::vsnprintf(buffer + buffer_offset, buffer_size - buffer_offset,
                         format, arguments_copy);
      va_end(arguments_copy);

      // The code below may append a newline at the end of the buffer, which
      // requires an extra character.
      if (buffer_offset >= buffer_size - 1) {
        // The message did not fit into the buffer.
        if (iteration == 0) {
          // Re-run the loop and use a dynamically-allocated buffer. The buffer
          // will be large enough for the log message, an extra newline and a
          // null terminator.
          dynamic_buffer_size = buffer_offset + 2;
          continue;
        }

        // The dynamically-allocated buffer was incorrectly sized. This should
        // not happen, assuming a correct implementation of std::(v)snprintf.
        // Fail in tests, recover by truncating the log message in production.
        assert(false);
        buffer_offset = buffer_size - 1;
      }

      // Add a newline if necessary.
      if (buffer[buffer_offset - 1] != '\n') {
        buffer[buffer_offset] = '\n';
        ++buffer_offset;
      }

      assert(buffer_offset <= buffer_size);
      std::fwrite(buffer, 1, buffer_offset, fp_);
      std::fflush(fp_);

      if (iteration != 0) {
        delete[] buffer;
      }
      break;
    }
  }